

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xpath_query::evaluate_boolean(xpath_query *this,xpath_node *n)

{
  undefined8 uVar1;
  xpath_node *in_RSI;
  long *in_RDI;
  bool r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_stack_data *this_00;
  xpath_stack *in_stack_ffffffffffffe168;
  xpath_context *in_stack_ffffffffffffe170;
  xpath_ast_node *in_stack_ffffffffffffe178;
  byte local_40;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    local_1 = 0;
  }
  else {
    this_00 = (xpath_stack_data *)&stack0xffffffffffffffc8;
    impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)this_00,in_RSI,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data(this_00);
    local_1 = impl::anon_unknown_0::xpath_ast_node::eval_boolean
                        (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,
                         in_stack_ffffffffffffe168);
    if ((local_40 & 1) != 0) {
      uVar1 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc((bad_alloc *)this_00);
      __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

PUGI__FN bool xpath_query::evaluate_boolean(const xpath_node& n) const
	{
		if (!_impl) return false;

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		bool r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_boolean(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return false;
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}